

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::replace(QString *this,QString *before,QLatin1StringView after,CaseSensitivity cs)

{
  QChar after_00;
  char16_t *before_00;
  long in_FS_OFFSET;
  QVarLengthArray<char16_t,_256LL> a;
  QVarLengthArray<char16_t,_256LL> local_250;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((after.m_size == 1) && ((before->d).size == 1)) {
    after_00.ucs._1_1_ = 0;
    after_00.ucs._0_1_ = *after.m_data;
    replace(this,(QChar)*(before->d).ptr,after_00,cs);
  }
  else {
    memset(&local_250,0xaa,0x218);
    qt_from_latin1_to_qvla(&local_250,after);
    before_00 = (before->d).ptr;
    if ((QChar *)before_00 == (QChar *)0x0) {
      before_00 = L"";
    }
    replace(this,(QChar *)before_00,(before->d).size,
            (QChar *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr,after.m_size,cs);
    QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(&local_250);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::replace(const QString &before, QLatin1StringView after, Qt::CaseSensitivity cs)
{
    const qsizetype alen = after.size();
    if (before.size() == 1 && alen == 1)
        return replace(before.front(), after.front(), cs);

    QVarLengthArray<char16_t> a = qt_from_latin1_to_qvla(after);
    return replace(before.constData(), before.d.size, (const QChar *)a.data(), alen, cs);
}